

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O2

void __thiscall dynamicgraph::OutStringStream::~OutStringStream(OutStringStream *this,void **vtt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
       = pp_Var1;
  *(void **)((long)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream + (long)pp_Var1[-3]) = vtt[5];
  pvVar2 = *(void **)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>
                      .field_0x70;
  if (pvVar2 != (void *)0x0) {
    operator_delete__(pvVar2);
  }
  std::__cxx11::string::~string
            ((string *)
             &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x90);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

OutStringStream::~OutStringStream() {
  dgDEBUGIN(15);
  delete[] buffer;
  dgDEBUGOUT(15);
}